

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  byte bVar1;
  char *pcVar2;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  long *local_90;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  bool local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  bVar1 = **(byte **)this;
  pcVar2 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar2 = "true";
  }
  local_48 = (long *)&uStack_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar2,pcVar2 + ((ulong)bVar1 ^ 5));
  if (local_48 == (long *)&uStack_38) {
    uStack_98 = uStack_30;
  }
  else {
    uStack_a0 = CONCAT44(uStack_34,uStack_38);
    if (local_48 != &uStack_a0) {
      local_90 = local_48;
      local_80 = uStack_a0;
      goto LAB_0022bb00;
    }
  }
  local_90 = &local_80;
  local_80 = CONCAT44(uStack_34,uStack_38);
  uStack_78 = (undefined4)uStack_98;
  uStack_74 = uStack_98._4_4_;
LAB_0022bb00:
  uStack_a0 = CONCAT44(uStack_34,uStack_38);
  uStack_a0 = uStack_a0 & 0xffffffffffffff00;
  local_70 = (bool)bVar1;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_90,CONCAT44(uStack_3c,local_40) + (long)local_90);
  __return_storage_ptr__->passed = local_70;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_68,local_60 + (long)local_68);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }